

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void print(AmsAddr *addr,ostream *out)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<(out,"AmsAddr: ");
  *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) =
       *(uint *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x18) & 0xffffffb5 | 2;
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)(byte)addr->netId);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)(byte)addr->field_0x1);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)(byte)addr->field_0x2);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)(byte)addr->field_0x3);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)(byte)addr->field_0x4);
  poVar1 = std::operator<<(poVar1,'.');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,(uint)(byte)addr->field_0x5);
  poVar1 = std::operator<<(poVar1,':');
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,addr->port);
  std::operator<<(poVar1,'\n');
  return;
}

Assistant:

void print(const AmsAddr& addr, std::ostream& out)
{
    out << "AmsAddr: " << std::dec <<
        (int)addr.netId.b[0] << '.' << (int)addr.netId.b[1] << '.' << (int)addr.netId.b[2] << '.' <<
        (int)addr.netId.b[3] << '.' << (int)addr.netId.b[4] << '.' << (int)addr.netId.b[5] << ':' <<
        addr.port << '\n';
}